

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

PosixZone *
anon_unknown.dwarf_1242596::PosixZone::parse(PosixZone *__return_storage_ptr__,char **pos,char *end)

{
  char cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  QString *this;
  QString *size;
  QString *end_00;
  QString *begin;
  QString *pQVar8;
  long in_FS_OFFSET;
  QLatin1StringView local_78;
  QLatin1StringView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QString *)*pos;
  begin = this;
  if (*(char *)&(this->d).d == '<') {
    this = (QString *)((long)&(this->d).d + 1);
    for (pQVar8 = this; (pQVar8 < end && (*(char *)&(pQVar8->d).d != '>'));
        pQVar8 = (QString *)((long)&(pQVar8->d).d + 1)) {
    }
    begin = (QString *)((long)&(pQVar8->d).d + 1);
  }
  else {
    while ((pQVar8 = begin, begin < end && ((byte)((*(byte *)&(begin->d).d | 0x20) + 0x9f) < 0x1a)))
    {
      begin = (QString *)((long)&(begin->d).d + 1);
    }
  }
  *pos = (char *)begin;
  if ((long)pQVar8 - (long)this < 3) {
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    __return_storage_ptr__->offset = -0x80000000;
    goto LAB_003b5156;
  }
  size = this;
  end_00 = begin;
  if ((begin < end) && ((cVar1 = *(char *)&(begin->d).d, cVar1 == '-' || (cVar1 == '+')))) {
    end_00 = (QString *)((long)&(begin->d).d + 1);
  }
  while ((end_00 < end &&
         (pvVar7 = memchr("0123456789:",(int)*(char *)&(end_00->d).d,0xc), pvVar7 != (void *)0x0)))
  {
    end_00 = (QString *)((long)&(end_00->d).d + 1);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::fromUtf8((QString *)&local_58,this,(char *)((long)pQVar8 - (long)this),(qsizetype)size);
  if (begin < end_00) {
    cVar1 = *(char *)&(begin->d).d;
    if (cVar1 == '-') {
      begin = (QString *)((long)&(begin->d).d + 1);
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (cVar1 == '+') {
        begin = (QString *)((long)&(begin->d).d + 1);
      }
    }
    iVar6 = parsePosixTime((char *)begin,(char *)end_00);
    if (bVar5) {
      iVar6 = -iVar6;
    }
    *pos = (char *)end_00;
    if (iVar6 != 0) goto LAB_003b50b1;
    iVar6 = 0;
LAB_003b5129:
    qVar4 = local_58.size;
    pcVar3 = local_58.ptr;
    pDVar2 = local_58.d;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.d = pDVar2;
    (__return_storage_ptr__->name).d.ptr = pcVar3;
    local_58.size = 0;
    (__return_storage_ptr__->name).d.size = qVar4;
  }
  else {
    *pos = (char *)end_00;
    iVar6 = -0x80000000;
LAB_003b50b1:
    local_68.m_size = 3;
    local_68.m_data = "UTC";
    bVar5 = ::operator==((QString *)&local_58,&local_68);
    if (!bVar5) {
      local_78.m_size = 3;
      local_78.m_data = "GMT";
      bVar5 = ::operator==((QString *)&local_58,&local_78);
      if (!bVar5) goto LAB_003b5129;
    }
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    iVar6 = -0x80000000;
  }
  __return_storage_ptr__->offset = iVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_003b5156:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

PosixZone PosixZone::parse(const char *&pos, const char *end)
{
    static const char offsetChars[] = "0123456789:";

    const char *nameBegin = pos;
    const char *nameEnd;
    Q_ASSERT(pos < end);

    if (*pos == '<') {
        ++nameBegin;    // skip the '<'
        nameEnd = nameBegin;
        while (nameEnd < end && *nameEnd != '>') {
            // POSIX says only alphanumeric, but we allow anything
            ++nameEnd;
        }
        pos = nameEnd + 1;      // skip the '>'
    } else {
        nameEnd = nameBegin;
        while (nameEnd < end && asciiIsLetter(*nameEnd))
            ++nameEnd;
        pos = nameEnd;
    }
    if (nameEnd - nameBegin < 3)
        return {};  // name must be at least 3 characters long

    // zone offset, form [+-]hh:mm:ss
    const char *zoneBegin = pos;
    const char *zoneEnd = pos;
    if (zoneEnd < end && (zoneEnd[0] == '+' || zoneEnd[0] == '-'))
        ++zoneEnd;
    while (zoneEnd < end) {
        if (strchr(offsetChars, char(*zoneEnd)) == nullptr)
            break;
        ++zoneEnd;
    }

    QString name = QString::fromUtf8(nameBegin, nameEnd - nameBegin);
    const int offset = zoneEnd > zoneBegin ? parsePosixOffset(zoneBegin, zoneEnd) : InvalidOffset;
    pos = zoneEnd;
    // UTC+hh:mm:ss or GMT+hh:mm:ss should be read as offsets from UTC, not as a
    // POSIX rule naming a zone as UTC or GMT and specifying a non-zero offset.
    if (offset != 0 && (name =="UTC"_L1 || name == "GMT"_L1))
        return {};
    return {std::move(name), offset};
}